

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
::_add_to(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
          *this,Column *column,Tmp_column *set,uint coef)

{
  pointer pEVar1;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar2;
  ID_index local_2c;
  node_ptr local_28;
  
  local_28 = (node_ptr)&column->column_;
  while (local_28 = (((type *)&local_28->next_)->data_).root_plus_size_.m_header.super_node.next_,
        local_28 != (node_ptr)&column->column_) {
    pEVar1 = boost::intrusive::
             bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>,_boost::intrusive::list_node<void_*>_*,_Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>::Matrix_column_tag,_1U>
             ::to_value_ptr(&local_28);
    local_2c = pEVar1->rowIndex_;
    pVar2 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::_M_insert_unique<unsigned_int>(&set->_M_t,&local_2c);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)set,(_Base_ptr)pVar2.first._M_node);
    }
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_add_to(const Column& column,
                                                 Tmp_column& set,
                                                 [[maybe_unused]] unsigned int coef)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    std::pair<typename std::set<Index>::iterator, bool> res_insert;
    for (const Entry& entry : column) {
      res_insert = set.insert(entry.get_row_index());
      if (!res_insert.second) {
        set.erase(res_insert.first);
      }
    }
  } else {
    auto& operators = colSettings_->operators;
    for (const Entry& entry : column) {
      auto res = set.emplace(entry.get_row_index(), entry.get_element());
      if (res.second){
        operators.multiply_inplace(res.first->second, coef);
      } else {
        operators.multiply_and_add_inplace_back(entry.get_element(), coef, res.first->second);
        if (res.first->second == Field_operators::get_additive_identity()) {
          set.erase(res.first);
        }
      }
    }
  }
}